

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

lua_Integer luaV_idiv(lua_State *L,lua_Integer m,lua_Integer n)

{
  lua_State *local_30;
  lua_Integer q;
  lua_Integer n_local;
  lua_Integer m_local;
  lua_State *L_local;
  
  if (n + 1U < 2) {
    if (n == 0) {
      luaG_runerror(L,"attempt to divide by zero");
    }
    L_local = (lua_State *)-m;
  }
  else {
    local_30 = (lua_State *)(m / n);
    if (((m ^ n) < 0) && (m % n != 0)) {
      local_30 = (lua_State *)&local_30[-1].field_0xcf;
    }
    L_local = local_30;
  }
  return (lua_Integer)L_local;
}

Assistant:

lua_Integer luaV_idiv (lua_State *L, lua_Integer m, lua_Integer n) {
  if (unlikely(l_castS2U(n) + 1u <= 1u)) {  /* special cases: -1 or 0 */
    if (n == 0)
      luaG_runerror(L, "attempt to divide by zero");
    return intop(-, 0, m);   /* n==-1; avoid overflow with 0x80000...//-1 */
  }
  else {
    lua_Integer q = m / n;  /* perform C division */
    if ((m ^ n) < 0 && m % n != 0)  /* 'm/n' would be negative non-integer? */
      q -= 1;  /* correct result for different rounding */
    return q;
  }
}